

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

void __thiscall fasttext::Meter::writeGeneralMetrics(Meter *this,ostream *out,int32_t k)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *pvVar3;
  int in_EDX;
  Metrics *in_RSI;
  long in_RDI;
  double dVar4;
  Metrics *this_00;
  
  poVar2 = std::operator<<((ostream *)in_RSI,"N");
  poVar2 = std::operator<<(poVar2,"\t");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(ulong *)(in_RDI + 0x30));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  this_00 = in_RSI;
  _Var1 = std::setprecision(3);
  std::operator<<((ostream *)this_00,_Var1);
  poVar2 = std::operator<<((ostream *)in_RSI,"P@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2,"\t");
  dVar4 = Metrics::precision(this_00);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)in_RSI,"R@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2,"\t");
  dVar4 = Metrics::recall(this_00);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Meter::writeGeneralMetrics(std::ostream& out, int32_t k) const {
  out << "N"
      << "\t" << nexamples_ << std::endl;
  out << std::setprecision(3);
  out << "P@" << k << "\t" << metrics_.precision() << std::endl;
  out << "R@" << k << "\t" << metrics_.recall() << std::endl;
}